

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

char * stringcache_len_internal(StringCache *cache,char *str,uint len,int addmissing)

{
  char *__s1;
  byte bVar1;
  uint32 uVar2;
  int iVar3;
  StringBucket *pSVar4;
  char *bstr;
  StringBucket *prev;
  StringBucket *bucket;
  uint8 hash;
  int addmissing_local;
  uint len_local;
  char *str_local;
  StringCache *cache_local;
  
  uVar2 = hash_string(str,(ulong)len);
  bVar1 = (byte)uVar2 & (char)cache->table_size - 1U;
  prev = cache->hashtable[bVar1];
  bstr = (char *)0x0;
  while( true ) {
    if (prev == (StringBucket *)0x0) {
      if (addmissing == 0) {
        cache_local = (StringCache *)0x0;
      }
      else {
        pSVar4 = (StringBucket *)(*cache->m)(len + 0x11,cache->d);
        if (pSVar4 == (StringBucket *)0x0) {
          cache_local = (StringCache *)0x0;
        }
        else {
          pSVar4->string = (char *)(pSVar4 + 1);
          memcpy(pSVar4->string,str,(ulong)len);
          pSVar4->string[len] = '\0';
          pSVar4->next = cache->hashtable[bVar1];
          cache->hashtable[bVar1] = pSVar4;
          cache_local = (StringCache *)pSVar4->string;
        }
      }
      return (char *)cache_local;
    }
    __s1 = prev->string;
    iVar3 = strncmp(__s1,str,(ulong)len);
    if ((iVar3 == 0) && (__s1[len] == '\0')) break;
    bstr = (char *)prev;
    prev = prev->next;
  }
  if (bstr == (char *)0x0) {
    return __s1;
  }
  if (*(StringBucket **)(bstr + 8) == prev) {
    *(StringBucket **)(bstr + 8) = prev->next;
    prev->next = cache->hashtable[bVar1];
    cache->hashtable[bVar1] = prev;
    return __s1;
  }
  __assert_fail("prev->next == bucket",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                ,0x173,
                "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
               );
}

Assistant:

static const char *stringcache_len_internal(StringCache *cache,
                                            const char *str,
                                            const unsigned int len,
                                            const int addmissing)
{
    const uint8 hash = hash_string(str, len) & (cache->table_size-1);
    StringBucket *bucket = cache->hashtable[hash];
    StringBucket *prev = NULL;
    while (bucket)
    {
        const char *bstr = bucket->string;
        if ((strncmp(bstr, str, len) == 0) && (bstr[len] == 0))
        {
            // Matched! Move this to the front of the list.
            if (prev != NULL)
            {
                assert(prev->next == bucket);
                prev->next = bucket->next;
                bucket->next = cache->hashtable[hash];
                cache->hashtable[hash] = bucket;
            } // if
            return bstr; // already cached
        } // if
        prev = bucket;
        bucket = bucket->next;
    } // while

    // no match!
    if (!addmissing)
        return NULL;

    // add to the table.
    bucket = (StringBucket *) cache->m(sizeof (StringBucket) + len + 1, cache->d);
    if (bucket == NULL)
        return NULL;
    bucket->string = (char *)(bucket + 1);
    memcpy(bucket->string, str, len);
    bucket->string[len] = '\0';
    bucket->next = cache->hashtable[hash];
    cache->hashtable[hash] = bucket;
    return bucket->string;
}